

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

uint8_t * protozero::proto_utils::ParseVarInt(uint8_t *start,uint8_t *end,uint64_t *out_value)

{
  byte bVar1;
  byte *pbVar2;
  uint32_t shift;
  ulong uVar3;
  uint8_t *pos;
  uint64_t uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  pbVar2 = start;
  while ((pbVar2 < end && (uVar3 < 0x40))) {
    bVar1 = *pbVar2;
    pbVar2 = pbVar2 + 1;
    uVar4 = uVar4 | (ulong)(bVar1 & 0x7f) << ((byte)uVar3 & 0x3f);
    uVar3 = uVar3 + 7;
    if (-1 < (char)bVar1) {
LAB_0033e4f0:
      *out_value = uVar4;
      return pbVar2;
    }
  }
  uVar4 = 0;
  pbVar2 = start;
  goto LAB_0033e4f0;
}

Assistant:

inline const uint8_t* ParseVarInt(const uint8_t* start,
                                  const uint8_t* end,
                                  uint64_t* out_value) {
  const uint8_t* pos = start;
  uint64_t value = 0;
  for (uint32_t shift = 0; pos < end && shift < 64u; shift += 7) {
    // Cache *pos into |cur_byte| to prevent that the compiler dereferences the
    // pointer twice (here and in the if() below) due to char* aliasing rules.
    uint8_t cur_byte = *pos++;
    value |= static_cast<uint64_t>(cur_byte & 0x7f) << shift;
    if ((cur_byte & 0x80) == 0) {
      // In valid cases we get here.
      *out_value = value;
      return pos;
    }
  }
  *out_value = 0;
  return start;
}